

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  Matrix<double,__1,_1,_0,__1,_1> *__n;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ppm_image image;
  undefined1 local_88 [24];
  long local_70;
  Scalar local_68;
  Scalar local_60;
  ppm_image local_58;
  
  local_88._0_4_ = 0x100;
  local_68 = (Scalar)CONCAT44(local_68._4_4_,0x100);
  sisl::utility::ppm_image::ppm_image(&local_58,(int *)local_88,(int *)&local_68);
  uVar2 = 0;
  do {
    uVar4 = 0;
    do {
      local_88._0_8_ =
           sisl::
           array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator()(&local_58.m_aArray,uVar2,uVar4);
      local_88._8_8_ = 0;
      local_88._16_8_ = 1;
      local_70 = 1;
      if ((((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 1)
      goto LAB_00102594;
      *(((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 1.0;
      local_68 = 0.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,
                          &local_68);
      local_60 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,&local_60);
      if ((local_70 + local_88._8_8_ !=
           (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88._0_8_)->m_storage)
           .m_rows) || (local_88._16_8_ != 1)) goto LAB_001025b3;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != 10);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 10);
  uVar2 = 10;
  do {
    uVar3 = 0;
    do {
      local_88._0_8_ =
           sisl::
           array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator()(&local_58.m_aArray,uVar2,(ulong)uVar3);
      local_88._8_8_ = 0;
      local_88._16_8_ = 1;
      local_70 = 1;
      if ((((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 1)
      goto LAB_00102594;
      *(((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0;
      local_68 = 1.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,
                          &local_68);
      local_60 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,&local_60);
      if ((local_70 + local_88._8_8_ !=
           (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88._0_8_)->m_storage)
           .m_rows) || (local_88._16_8_ != 1)) goto LAB_001025b3;
      uVar3 = uVar3 + 1;
    } while (uVar3 != 10);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x14);
  uVar2 = 0x14;
  do {
    uVar3 = 0;
    do {
      local_88._0_8_ =
           sisl::
           array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator()(&local_58.m_aArray,uVar2,(ulong)uVar3);
      local_88._8_8_ = 0;
      local_88._16_8_ = 1;
      local_70 = 1;
      if ((((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 1) {
LAB_00102594:
        local_70 = 1;
        local_88._16_8_ = 1;
        local_88._8_8_ = 0;
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                      "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      *(((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_)->
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0;
      local_68 = 0.0;
      pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88,
                          &local_68);
      local_60 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,&local_60);
      if ((local_70 + local_88._8_8_ !=
           (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_88._0_8_)->m_storage)
           .m_rows) || (local_88._16_8_ != 1)) {
LAB_001025b3:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 10);
    uVar2 = uVar2 + 1;
    if (uVar2 == 0x1e) {
      __n = (Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_;
      local_88._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"200_output.ppm","");
      sisl::utility::ppm_image::write(&local_58,(int)local_88,(void *)0x1,(size_t)__n);
      if ((Matrix<double,__1,_1,_0,__1,_1> *)local_88._0_8_ !=
          (Matrix<double,__1,_1,_0,__1,_1> *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
      sisl::
      array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~array_n(&local_58.m_aArray);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char const *argv[])
{
	// The most simple way to output an image
	// in sisl, is to create a ppm image object
	sisl::utility::ppm_image image(256, 256);


	// then fill in its cells with pixel rgb values
	// images start at 0,0 top left
	
	// square 1
	for(int i = 0; i < 10; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 1.0, 0.0, 0.0; // all red
		}

	// square 2
	for(int i = 10; i < 20; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 1.0, 0.0; // all green
		}

	// square 3
	for(int i = 20; i < 30; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 0.0, 1.0; // all blue
		}

	image.write("200_output.ppm");
	return 0;
}